

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int base64_decode(char *in_base64,int in_len,char *out_bin,int out_len)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  byte bVar4;
  byte *pbVar5;
  char cVar6;
  
  iVar3 = (int)out_bin;
  pbVar5 = (byte *)(in_base64 + in_len);
  pbVar2 = (byte *)(out_bin + out_len);
  *out_bin = '\0';
  for (; pbVar1 = (byte *)out_bin, out_bin < pbVar2; out_bin = (char *)((byte *)out_bin + 3)) {
    do {
      if ((byte *)in_base64 == pbVar5) goto LAB_0010d492;
      cVar6 = -1;
      if (0xae < (byte)(*in_base64 + 0x84U)) {
        cVar6 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
      }
      in_base64 = (char *)((byte *)in_base64 + 1);
    } while (cVar6 < '\0');
    *out_bin = cVar6 << 2;
    do {
      if ((byte *)in_base64 == pbVar5) goto LAB_0010d492;
      bVar4 = 0xff;
      if (0xae < (byte)(*in_base64 + 0x84U)) {
        bVar4 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
      }
      in_base64 = (char *)((byte *)in_base64 + 1);
    } while ((char)bVar4 < '\0');
    pbVar1 = (byte *)out_bin + 1;
    *out_bin = bVar4 >> 4 & 3 | cVar6 << 2;
    if (pbVar2 <= pbVar1) break;
    *pbVar1 = bVar4 << 4;
    do {
      if ((byte *)in_base64 == pbVar5) goto LAB_0010d492;
      bVar4 = 0xff;
      if (0xae < (byte)(*in_base64 + 0x84U)) {
        bVar4 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
      }
      in_base64 = (char *)((byte *)in_base64 + 1);
    } while ((char)bVar4 < '\0');
    pbVar1 = (byte *)out_bin + 2;
    ((byte *)out_bin)[1] = ((byte *)out_bin)[1] | bVar4 >> 2 & 0xf;
    if (pbVar2 <= pbVar1) break;
    *pbVar1 = bVar4 << 6;
    do {
      if ((byte *)in_base64 == pbVar5) goto LAB_0010d492;
      bVar4 = 0xff;
      if (0xae < (byte)(*in_base64 + 0x84U)) {
        bVar4 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
      }
      in_base64 = (char *)((byte *)in_base64 + 1);
    } while ((char)bVar4 < '\0');
    ((byte *)out_bin)[2] = ((byte *)out_bin)[2] | bVar4 & 0x3f;
  }
LAB_0010d492:
  return (int)pbVar1 - iVar3;
}

Assistant:

int
base64_decode(const char *in_base64, int in_len,
	      char *out_bin, int out_len)
{
	struct base64_decodestate state;
	base64_decodestate_init(&state);
	return base64_decode_block(in_base64, in_len,
				   out_bin, out_len, &state);
}